

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethpccal.cpp
# Opt level: O3

int32_t __thiscall icu_63::EthiopicCalendar::handleGetExtendedYear(EthiopicCalendar *this)

{
  int iVar1;
  UCalendarDateFields UVar2;
  int iVar3;
  
  UVar2 = Calendar::newerField((Calendar *)this,UCAL_EXTENDED_YEAR,UCAL_YEAR);
  if (UVar2 == UCAL_EXTENDED_YEAR) {
    iVar3 = 1;
    if (0 < (this->super_CECalendar).super_Calendar.fStamp[0x13]) {
      iVar3 = (this->super_CECalendar).super_Calendar.fFields[0x13];
    }
  }
  else if (*(int *)&(this->super_CECalendar).super_Calendar.field_0x264 == 1) {
    iVar3 = 1;
    if (0 < (this->super_CECalendar).super_Calendar.fStamp[1]) {
      iVar3 = (this->super_CECalendar).super_Calendar.fFields[1] + -0x157c;
    }
  }
  else {
    iVar1 = (this->super_CECalendar).super_Calendar.fStamp[1];
    if (((this->super_CECalendar).super_Calendar.fStamp[0] < 1) ||
       ((this->super_CECalendar).super_Calendar.fFields[0] == 1)) {
      if (iVar1 < 1) {
        iVar3 = 1;
      }
      else {
        iVar3 = (this->super_CECalendar).super_Calendar.fFields[1];
      }
    }
    else {
      iVar3 = -0x157b;
      if (0 < iVar1) {
        iVar3 = (this->super_CECalendar).super_Calendar.fFields[1] + -0x157c;
      }
    }
  }
  return iVar3;
}

Assistant:

int32_t
EthiopicCalendar::handleGetExtendedYear()
{
    // Ethiopic calendar uses EXTENDED_YEAR aligned to
    // Amelete Hihret year always.
    int32_t eyear;
    if (newerField(UCAL_EXTENDED_YEAR, UCAL_YEAR) == UCAL_EXTENDED_YEAR) {
        eyear = internalGet(UCAL_EXTENDED_YEAR, 1); // Default to year 1
    } else if (isAmeteAlemEra()) {
        eyear = internalGet(UCAL_YEAR, 1 + AMETE_MIHRET_DELTA)
            - AMETE_MIHRET_DELTA; // Default to year 1 of Amelete Mihret
    } else {
        // The year defaults to the epoch start, the era to AMETE_MIHRET
        int32_t era = internalGet(UCAL_ERA, AMETE_MIHRET);
        if (era == AMETE_MIHRET) {
            eyear = internalGet(UCAL_YEAR, 1); // Default to year 1
        } else {
            eyear = internalGet(UCAL_YEAR, 1) - AMETE_MIHRET_DELTA;
        }
    }
    return eyear;
}